

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O2

void leveldb::_Test_Append::_RunIt(void)

{
  WriteBatch *b;
  WriteBatch *b_00;
  WriteBatch *b_01;
  WriteBatch *b_02;
  string sStack_210;
  WriteBatch WStack_1f0;
  WriteBatch WStack_1d0;
  Tester TStack_1b0;
  
  WriteBatch::WriteBatch(&WStack_1d0);
  WriteBatch::WriteBatch(&WStack_1f0);
  WriteBatchInternal::SetSequence(&WStack_1d0,200);
  WriteBatchInternal::SetSequence(&WStack_1f0,300);
  WriteBatch::Append(&WStack_1d0,&WStack_1f0);
  test::Tester::Tester
            (&TStack_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x61);
  PrintContents_abi_cxx11_(&sStack_210,(leveldb *)&WStack_1d0,b);
  test::Tester::IsEq<char[1],std::__cxx11::string>(&TStack_1b0,(char (*) [1])0x10c022,&sStack_210);
  std::__cxx11::string::~string((string *)&sStack_210);
  test::Tester::~Tester(&TStack_1b0);
  TStack_1b0._0_8_ = "a";
  TStack_1b0.fname_ = (char *)0x1;
  sStack_210._M_dataplus._M_p = "va";
  sStack_210._M_string_length = 2;
  WriteBatch::Put(&WStack_1f0,(Slice *)&TStack_1b0,(Slice *)&sStack_210);
  WriteBatch::Append(&WStack_1d0,&WStack_1f0);
  test::Tester::Tester
            (&TStack_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,100);
  PrintContents_abi_cxx11_(&sStack_210,(leveldb *)&WStack_1d0,b_00);
  test::Tester::IsEq<char[15],std::__cxx11::string>
            (&TStack_1b0,(char (*) [15])"Put(a, va)@200",&sStack_210);
  std::__cxx11::string::~string((string *)&sStack_210);
  test::Tester::~Tester(&TStack_1b0);
  WriteBatch::Clear(&WStack_1f0);
  TStack_1b0._0_8_ = "b";
  TStack_1b0.fname_ = (char *)0x1;
  sStack_210._M_dataplus._M_p = "vb";
  sStack_210._M_string_length = 2;
  WriteBatch::Put(&WStack_1f0,(Slice *)&TStack_1b0,(Slice *)&sStack_210);
  WriteBatch::Append(&WStack_1d0,&WStack_1f0);
  test::Tester::Tester
            (&TStack_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x6b);
  PrintContents_abi_cxx11_(&sStack_210,(leveldb *)&WStack_1d0,b_01);
  test::Tester::IsEq<char[29],std::__cxx11::string>
            (&TStack_1b0,(char (*) [29])"Put(a, va)@200Put(b, vb)@201",&sStack_210);
  std::__cxx11::string::~string((string *)&sStack_210);
  test::Tester::~Tester(&TStack_1b0);
  TStack_1b0._0_8_ = "foo";
  TStack_1b0.fname_ = (char *)0x3;
  WriteBatch::Delete(&WStack_1f0,(Slice *)&TStack_1b0);
  WriteBatch::Append(&WStack_1d0,&WStack_1f0);
  test::Tester::Tester
            (&TStack_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x73);
  PrintContents_abi_cxx11_(&sStack_210,(leveldb *)&WStack_1d0,b_02);
  test::Tester::IsEq<char[58],std::__cxx11::string>
            (&TStack_1b0,(char (*) [58])"Put(a, va)@200Put(b, vb)@202Put(b, vb)@201Delete(foo)@203",
             &sStack_210);
  std::__cxx11::string::~string((string *)&sStack_210);
  test::Tester::~Tester(&TStack_1b0);
  WriteBatch::~WriteBatch(&WStack_1f0);
  WriteBatch::~WriteBatch(&WStack_1d0);
  return;
}

Assistant:

TEST(WriteBatchTest, Append) {
  WriteBatch b1, b2;
  WriteBatchInternal::SetSequence(&b1, 200);
  WriteBatchInternal::SetSequence(&b2, 300);
  b1.Append(b2);
  ASSERT_EQ("", PrintContents(&b1));
  b2.Put("a", "va");
  b1.Append(b2);
  ASSERT_EQ("Put(a, va)@200", PrintContents(&b1));
  b2.Clear();
  b2.Put("b", "vb");
  b1.Append(b2);
  ASSERT_EQ(
      "Put(a, va)@200"
      "Put(b, vb)@201",
      PrintContents(&b1));
  b2.Delete("foo");
  b1.Append(b2);
  ASSERT_EQ(
      "Put(a, va)@200"
      "Put(b, vb)@202"
      "Put(b, vb)@201"
      "Delete(foo)@203",
      PrintContents(&b1));
}